

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

void Gia_ManFraigSweepPerform(Gia_Man_t *p,void *pPars)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p_00;
  Aig_Man_t *pNew;
  void *pPars_local;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManToAigSimple(p);
  iVar1 = Gia_ManObjNum(p);
  iVar2 = Aig_ManObjNum(p_00);
  if (iVar1 == iVar2) {
    Dch_ComputeEquivalences(p_00,(Dch_Pars_t *)pPars);
    Gia_ManReprFromAigRepr(p_00,p);
    Aig_ManStop(p_00);
    return;
  }
  __assert_fail("Gia_ManObjNum(p) == Aig_ManObjNum(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSweep.c"
                ,0x236,"void Gia_ManFraigSweepPerform(Gia_Man_t *, void *)");
}

Assistant:

void Gia_ManFraigSweepPerform( Gia_Man_t * p, void * pPars )
{
    Aig_Man_t * pNew;
    pNew = Gia_ManToAigSimple( p );
    assert( Gia_ManObjNum(p) == Aig_ManObjNum(pNew) );
    Dch_ComputeEquivalences( pNew, (Dch_Pars_t *)pPars );
    Gia_ManReprFromAigRepr( pNew, p );
    Aig_ManStop( pNew );
}